

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O3

Abc_ManTime_t * Abc_ManTimeStart(Abc_Ntk_t *pNtk)

{
  float fVar1;
  Abc_ManTime_t *p;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  
  p = (Abc_ManTime_t *)calloc(1,0x40);
  pNtk->pManTime = p;
  pVVar2 = (Vec_Ptr_t *)calloc(1,0x10);
  p->vArrs = pVVar2;
  pVVar2 = (Vec_Ptr_t *)calloc(1,0x10);
  p->vReqs = pVVar2;
  Abc_ManTimeExpand(p,pNtk->vObjs->nSize + 1,0);
  pVVar2 = pNtk->vCis;
  if (0 < pVVar2->nSize) {
    lVar3 = 0;
    do {
      fVar1 = (p->tArrDef).Rise;
      Abc_NtkTimeSetArrival(pNtk,*(int *)((long)pVVar2->pArray[lVar3] + 0x10),fVar1,fVar1);
      lVar3 = lVar3 + 1;
      pVVar2 = pNtk->vCis;
    } while (lVar3 < pVVar2->nSize);
  }
  pVVar2 = pNtk->vCos;
  if (0 < pVVar2->nSize) {
    lVar3 = 0;
    do {
      fVar1 = (p->tReqDef).Rise;
      Abc_NtkTimeSetRequired(pNtk,*(int *)((long)pVVar2->pArray[lVar3] + 0x10),fVar1,fVar1);
      lVar3 = lVar3 + 1;
      pVVar2 = pNtk->vCos;
    } while (lVar3 < pVVar2->nSize);
  }
  return p;
}

Assistant:

Abc_ManTime_t * Abc_ManTimeStart( Abc_Ntk_t * pNtk )
{
    int fUseZeroDefaultOutputRequired = 1;
    Abc_ManTime_t * p;
    Abc_Obj_t * pObj; int i;
    p = pNtk->pManTime = ABC_ALLOC( Abc_ManTime_t, 1 );
    memset( p, 0, sizeof(Abc_ManTime_t) );
    p->vArrs = Vec_PtrAlloc( 0 );
    p->vReqs = Vec_PtrAlloc( 0 );
    // set default default input=arrivals (assumed to be 0)
    // set default default output-requireds (can be either 0 or +infinity, based on the flag)
    p->tReqDef.Rise = fUseZeroDefaultOutputRequired ? 0 : ABC_INFINITY;
    p->tReqDef.Fall = fUseZeroDefaultOutputRequired ? 0 : ABC_INFINITY;
    // extend manager
    Abc_ManTimeExpand( p, Abc_NtkObjNumMax(pNtk) + 1, 0 );
    // set the default timing for CIs
    Abc_NtkForEachCi( pNtk, pObj, i )
        Abc_NtkTimeSetArrival( pNtk, Abc_ObjId(pObj), p->tArrDef.Rise, p->tArrDef.Rise );   
    // set the default timing for COs
    Abc_NtkForEachCo( pNtk, pObj, i )
        Abc_NtkTimeSetRequired( pNtk, Abc_ObjId(pObj), p->tReqDef.Rise, p->tReqDef.Rise );        
    return p;
}